

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cc
# Opt level: O3

RC __thiscall StatisticsMgr::Reset(StatisticsMgr *this,char *psKey)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  RC RVar4;
  uint uVar5;
  long lVar6;
  InternalNode *pIVar7;
  uint uVar8;
  uint uVar9;
  uint which;
  
  if (psKey == (char *)0x0) {
    return 0x2329;
  }
  uVar1 = (this->llStats).iLength;
  if ((int)uVar1 < 1) {
    which = 0;
LAB_00104366:
    RVar4 = 0x232a;
    if (which != uVar1) {
      LinkList<Statistic>::Delete(&this->llStats,which);
      RVar4 = 0;
    }
  }
  else {
    uVar2 = (this->llStats).iLastRef;
    which = 0;
    do {
      uVar9 = which + 1;
      if (uVar2 == 0xffffffff) {
        lVar6 = (ulong)((int)(uVar1 - uVar9) <= (int)uVar9) * 8 + 8;
        uVar2 = uVar1;
        if ((int)uVar9 < (int)(uVar1 - uVar9)) {
          uVar2 = 1;
        }
      }
      else {
        uVar8 = uVar9 - uVar2;
        uVar5 = -uVar8;
        if (0 < (int)uVar8) {
          uVar5 = uVar8;
        }
        if (uVar9 < uVar5) {
          lVar6 = 8;
          uVar2 = 1;
        }
        else {
          lVar6 = (ulong)((int)uVar5 < (int)(uVar1 - uVar9)) * 8 + 0x10;
          if ((int)(uVar1 - uVar9) <= (int)uVar5) {
            uVar2 = uVar1;
          }
        }
      }
      pIVar7 = *(InternalNode **)((long)&(this->llStats).iLength + lVar6);
      for (; uVar2 != uVar9; uVar2 = uVar2 + (-(uint)((int)which < (int)uVar2) | 1)) {
        pIVar7 = (&pIVar7->next)[(int)which < (int)uVar2];
      }
      (this->llStats).iLastRef = uVar9;
      (this->llStats).pnLastRef = pIVar7;
      iVar3 = strcmp(psKey,(pIVar7->Data).psKey);
      if (iVar3 == 0) goto LAB_00104366;
      uVar2 = uVar9;
      which = uVar9;
    } while (uVar1 != uVar9);
    RVar4 = 0x232a;
  }
  return RVar4;
}

Assistant:

RC StatisticsMgr::Reset(const char *psKey)
{
   int i, iCount;
   Statistic *pStat = NULL;

   if (psKey==NULL)
      return STAT_INVALID_ARGS;

   iCount = llStats.GetLength();

   for (i=0; i < iCount; i++) {
      pStat = llStats[i];
      if (*pStat == psKey)
         break;
   }

   // If we found the statistic then remove it from the list
   if (i!=iCount)
      llStats.Delete(i);
   else
      return STAT_UNKNOWN_KEY;

   return 0;
}